

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void store_pool_init(png_store *ps,store_pool *pool)

{
  store_pool *pool_local;
  png_store *ps_local;
  
  memset(pool,0,0x50);
  pool->store = ps;
  pool->list = (store_memory *)0x0;
  pool->total = 0;
  pool->limit = 0;
  pool->current = 0;
  pool->max = 0;
  pool->max_total = 0;
  pool->max_limit = 0;
  pool->max_max = 0;
  store_pool_mark(pool->mark);
  return;
}

Assistant:

static void
store_pool_init(png_store *ps, store_pool *pool)
{
   memset(pool, 0, sizeof *pool);

   pool->store = ps;
   pool->list = NULL;
   pool->max = pool->current = pool->limit = pool->total = 0;
   pool->max_max = pool->max_limit = pool->max_total = 0;
   store_pool_mark(pool->mark);
}